

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INTEGER.c
# Opt level: O0

int asn_INTEGER2long(INTEGER_t *iptr,long *lptr)

{
  int *piVar1;
  byte *pbVar2;
  ulong *in_RSI;
  long *in_RDI;
  uint8_t *end1;
  long l;
  size_t size;
  uint8_t *end;
  uint8_t *b;
  ulong local_38;
  byte *local_20;
  int local_4;
  
  if (((in_RDI == (long *)0x0) || (*in_RDI == 0)) || (in_RSI == (ulong *)0x0)) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    local_4 = -1;
  }
  else {
    local_20 = (byte *)*in_RDI;
    pbVar2 = local_20 + (int)in_RDI[1];
    if (8 < (ulong)(long)(int)in_RDI[1]) {
      for (; local_20 < pbVar2 + -1; local_20 = local_20 + 1) {
        if (*local_20 == 0) {
          if ((local_20[1] & 0x80) != 0) break;
        }
        else if ((*local_20 != 0xff) || ((local_20[1] & 0x80) == 0)) break;
      }
      if (8 < (ulong)((long)pbVar2 - (long)local_20)) {
        piVar1 = __errno_location();
        *piVar1 = 0x22;
        return -1;
      }
    }
    if (pbVar2 == local_20) {
      *in_RSI = 0;
      local_4 = 0;
    }
    else {
      if ((int)(uint)*local_20 >> 7 == 0) {
        local_38 = 0;
      }
      else {
        local_38 = 0xffffffffffffffff;
      }
      for (; local_20 < pbVar2; local_20 = local_20 + 1) {
        local_38 = local_38 << 8 | (ulong)*local_20;
      }
      *in_RSI = local_38;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int
asn_INTEGER2long(const INTEGER_t *iptr, long *lptr) {
	uint8_t *b, *end;
	size_t size;
	long l;

	/* Sanity checking */
	if(!iptr || !iptr->buf || !lptr) {
		errno = EINVAL;
		return -1;
	}

	/* Cache the begin/end of the buffer */
	b = iptr->buf;	/* Start of the INTEGER buffer */
	size = iptr->size;
	end = b + size;	/* Where to stop */

	if(size > sizeof(long)) {
		uint8_t *end1 = end - 1;
		/*
		 * Slightly more advanced processing,
		 * able to >sizeof(long) bytes,
		 * when the actual value is small
		 * (0x0000000000abcdef would yield a fine 0x00abcdef)
		 */
		/* Skip out the insignificant leading bytes */
		for(; b < end1; b++) {
			switch(*b) {
			case 0x00: if((b[1] & 0x80) == 0) continue; break;
			case 0xff: if((b[1] & 0x80) != 0) continue; break;
			}
			break;
		}

		size = end - b;
		if(size > sizeof(long)) {
			/* Still cannot fit the long */
			errno = ERANGE;
			return -1;
		}
	}

	/* Shortcut processing of a corner case */
	if(end == b) {
		*lptr = 0;
		return 0;
	}

	/* Perform the sign initialization */
	/* Actually l = -(*b >> 7); gains nothing, yet unreadable! */
	if((*b >> 7)) l = -1; else l = 0;

	/* Conversion engine */
	for(; b < end; b++)
		l = (l << 8) | *b;

	*lptr = l;
	return 0;
}